

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  ushort uVar1;
  Index *pIndex;
  i16 *piVar2;
  Schema *pSVar3;
  int iVar4;
  Schema **ppSVar5;
  ulong uVar6;
  Parse *pPVar7;
  
  if (pTab->nModuleArg == 0) {
    for (pIndex = pTab->pIndex; pIndex != (Index *)0x0; pIndex = pIndex->pNext) {
      if (zColl == (char *)0x0) {
LAB_00193d23:
        if (pTab->pSchema == (Schema *)0x0) {
          iVar4 = -1000000;
        }
        else {
          iVar4 = -1;
          ppSVar5 = &pParse->db->aDb->pSchema;
          do {
            iVar4 = iVar4 + 1;
            pSVar3 = *ppSVar5;
            ppSVar5 = ppSVar5 + 4;
          } while (pSVar3 != pTab->pSchema);
        }
        pPVar7 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar7 = pParse;
        }
        sqlite3CodeVerifySchema(pParse,iVar4);
        pPVar7->writeMask = pPVar7->writeMask | 1 << ((byte)iVar4 & 0x1f);
        sqlite3RefillIndex(pParse,pIndex,-1);
      }
      else {
        uVar1 = pIndex->nColumn;
        if ((ulong)uVar1 != 0) {
          piVar2 = pIndex->aiColumn;
          uVar6 = 0;
          do {
            if ((-1 < piVar2[uVar6]) &&
               (iVar4 = sqlite3StrICmp(pIndex->azColl[uVar6],zColl), iVar4 == 0)) goto LAB_00193d23;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
      }
    }
  }
  return;
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  if( !IsVirtual(pTab) ){
    Index *pIndex;              /* An index associated with pTab */

    for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
      if( zColl==0 || collationMatch(zColl, pIndex) ){
        int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
        sqlite3BeginWriteOperation(pParse, 0, iDb);
        sqlite3RefillIndex(pParse, pIndex, -1);
      }
    }
  }
}